

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speedtesting.cpp
# Opt level: O2

double hashALot<ThreeWiseHash<unsigned_int,unsigned_char>>
                 (int n,int L,uint ttimes,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *recorder,
                 vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  pointer puVar1;
  int iVar2;
  ulong uVar3;
  uint k;
  ulong uVar4;
  uint uVar5;
  ZTimer t;
  ThreeWiseHash<unsigned_int,_unsigned_char> hf;
  ZTimer local_4c8;
  ThreeWiseHash<unsigned_int,_unsigned_char> local_4a8;
  
  ZTimer::ZTimer(&local_4c8);
  for (uVar5 = 0; uVar5 != ttimes; uVar5 = uVar5 + 1) {
    ThreeWiseHash<unsigned_int,_unsigned_char>::ThreeWiseHash(&local_4a8,n,L);
    for (uVar4 = 0; (uint)n != uVar4; uVar4 = uVar4 + 1) {
      ThreeWiseHash<unsigned_int,_unsigned_char>::eat
                (&local_4a8,
                 (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar4]);
    }
    uVar4 = 0;
    while( true ) {
      uVar3 = (ulong)(uint)(n + (int)uVar4);
      puVar1 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <= uVar3) break;
      ThreeWiseHash<unsigned_int,_unsigned_char>::update(&local_4a8,puVar1[uVar4],puVar1[uVar3]);
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (recorder,&local_4a8.hashvalue);
    ThreeWiseHash<unsigned_int,_unsigned_char>::~ThreeWiseHash(&local_4a8);
  }
  iVar2 = ZTimer::split(&local_4c8);
  return (double)iVar2 / 1000.0;
}

Assistant:

double hashALot(int n, int L, uint ttimes, vector<uint32> &recorder,
                vector<unsigned char> &data) {
  ZTimer t;
  for (uint times = 0; times < ttimes; ++times) {
    hashfunction hf(n, L);
    for (uint k = 0; k < static_cast<uint>(n); ++k) {
      hf.eat(data[k]);
    }
    for (uint k = n; k < data.size(); ++k) {
      hf.update(data[k - n], data[k]);
    }
    /* The goal of the recorder is to prevent
    the compiler from deciding that this whole computation
    is not required!
    */
    recorder.push_back(hf.hashvalue);
  }
  return t.split() / 1000.0;
}